

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall
crnlib::dynamic_string::set_from_buf(dynamic_string *this,void *pBuf,uint buf_size)

{
  bool bVar1;
  uint in_EDX;
  void *in_RSI;
  dynamic_string *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_EDX < 0xffff) {
    bVar1 = ensure_buf(in_RDI,(uint)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
    if (bVar1) {
      if (in_EDX != 0) {
        memcpy(in_RDI->m_pStr,in_RSI,(ulong)in_EDX);
      }
      in_RDI->m_pStr[in_EDX] = '\0';
      in_RDI->m_len = (uint16)in_EDX;
      check(in_RDI);
    }
  }
  else {
    clear((dynamic_string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  }
  return in_RDI;
}

Assistant:

dynamic_string& dynamic_string::set_from_buf(const void* pBuf, uint buf_size) {
  CRNLIB_ASSERT(pBuf);

  if (buf_size >= cUINT16_MAX) {
    clear();
    return *this;
  }

#ifdef CRNLIB_BUILD_DEBUG
  if ((buf_size) && (memchr(pBuf, 0, buf_size) != NULL)) {
    CRNLIB_ASSERT(0);
    clear();
    return *this;
  }
#endif

  if (ensure_buf(buf_size, false)) {
    if (buf_size)
      memcpy(m_pStr, pBuf, buf_size);

    m_pStr[buf_size] = 0;

    m_len = static_cast<uint16>(buf_size);

    check();
  }

  return *this;
}